

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matd.c
# Opt level: O1

matd_t * matd_transpose(matd_t *a)

{
  matd_t mVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  matd_t *pmVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  
  if (a == (matd_t *)0x0) {
    __assert_fail("a != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/matd.c"
                  ,0x176,"matd_t *matd_transpose(const matd_t *)");
  }
  if ((a->ncols < 2) && (a->nrows < 2)) {
    mVar1 = a[1];
    pmVar5 = (matd_t *)calloc(1,0x10);
    pmVar5->nrows = 0;
    pmVar5->ncols = 0;
    pmVar5[1] = mVar1;
  }
  else {
    pmVar5 = matd_create(a->ncols,a->nrows);
    uVar2 = a->nrows;
    if (uVar2 != 0) {
      uVar3 = a->ncols;
      uVar6 = 0;
      uVar7 = 0;
      do {
        if ((ulong)uVar3 != 0) {
          uVar4 = pmVar5->ncols;
          uVar8 = (ulong)uVar3;
          uVar9 = uVar6;
          uVar10 = uVar7;
          do {
            pmVar5[(ulong)uVar10 + 1] = a[(ulong)uVar9 + 1];
            uVar10 = uVar10 + uVar4;
            uVar9 = uVar9 + 1;
            uVar8 = uVar8 - 1;
          } while (uVar8 != 0);
        }
        uVar7 = uVar7 + 1;
        uVar6 = uVar6 + uVar3;
      } while (uVar7 != uVar2);
    }
  }
  return pmVar5;
}

Assistant:

matd_t *matd_transpose(const matd_t *a)
{
    assert(a != NULL);

    if (matd_is_scalar(a))
        return matd_create_scalar(a->data[0]);

    matd_t *m = matd_create(a->ncols, a->nrows);

    for (int i = 0; i < a->nrows; i++) {
        for (int j = 0; j < a->ncols; j++) {
            MATD_EL(m, j, i) = MATD_EL(a, i, j);
        }
    }
    return m;
}